

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

AssignBlock128 tcu::astc::anon_unknown_0::generateVoidExtentBlock(VoidExtentParams *params)

{
  VoidExtentParams *params_local;
  AssignBlock128 block;
  
  AssignBlock128::AssignBlock128((AssignBlock128 *)&params_local);
  AssignBlock128::setBits((AssignBlock128 *)&params_local,0,8,0x1fc);
  AssignBlock128::setBit((AssignBlock128 *)&params_local,9,params->isHDR & 1);
  AssignBlock128::setBits((AssignBlock128 *)&params_local,10,0xb,3);
  AssignBlock128::setBits((AssignBlock128 *)&params_local,0xc,0x18,0x1fff);
  AssignBlock128::setBits((AssignBlock128 *)&params_local,0x19,0x25,0x1fff);
  AssignBlock128::setBits((AssignBlock128 *)&params_local,0x26,0x32,0x1fff);
  AssignBlock128::setBits((AssignBlock128 *)&params_local,0x33,0x3f,0x1fff);
  AssignBlock128::setBits((AssignBlock128 *)&params_local,0x40,0x4f,(uint)params->r);
  AssignBlock128::setBits((AssignBlock128 *)&params_local,0x50,0x5f,(uint)params->g);
  AssignBlock128::setBits((AssignBlock128 *)&params_local,0x60,0x6f,(uint)params->b);
  AssignBlock128::setBits((AssignBlock128 *)&params_local,0x70,0x7f,(uint)params->a);
  return (AssignBlock128)_params_local;
}

Assistant:

static AssignBlock128 generateVoidExtentBlock (const VoidExtentParams& params)
{
	AssignBlock128 block;

	block.setBits(0, 8, 0x1fc); // \note Marks void-extent block.
	block.setBit(9, params.isHDR);
	block.setBits(10, 11, 3); // \note Spec shows that these bits are both set, although they serve no purpose.

	// Extent coordinates - currently all-ones.
	block.setBits(12, 24, 0x1fff);
	block.setBits(25, 37, 0x1fff);
	block.setBits(38, 50, 0x1fff);
	block.setBits(51, 63, 0x1fff);

	DE_ASSERT(!params.isHDR || (!isFloat16InfOrNan(params.r) &&
								!isFloat16InfOrNan(params.g) &&
								!isFloat16InfOrNan(params.b) &&
								!isFloat16InfOrNan(params.a)));

	block.setBits(64,  79,  params.r);
	block.setBits(80,  95,  params.g);
	block.setBits(96,  111, params.b);
	block.setBits(112, 127, params.a);

	return block;
}